

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  
  if (_sectionStats->missingAssertions == true) {
    lazyPrint(this);
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x12);
    pcVar4 = "\nNo assertions in test case";
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_StreamingReporterBase).m_sectionStack.
                          super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x68)) {
      pcVar4 = "\nNo assertions in section";
    }
    std::operator<<((this->super_StreamingReporterBase).stream,pcVar4);
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream," \'");
    poVar3 = std::operator<<(poVar3,(string *)&_sectionStats->sectionInfo);
    poVar3 = std::operator<<(poVar3,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar3);
    Colour::~Colour((Colour *)poVar3);
  }
  bVar1 = this->m_headerPrinted;
  iVar2 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xb])();
  if (bVar1 == true) {
    if (iVar2 == 1) {
      std::operator<<((this->super_StreamingReporterBase).stream,"Completed in ");
      poVar3 = std::ostream::_M_insert<double>(_sectionStats->durationInSeconds);
      poVar3 = std::operator<<(poVar3,"s");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    this->m_headerPrinted = false;
  }
  else if (iVar2 == 1) {
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,
                             (string *)&_sectionStats->sectionInfo);
    std::operator<<(poVar3," completed in ");
    poVar3 = std::ostream::_M_insert<double>(_sectionStats->durationInSeconds);
    poVar3 = std::operator<<(poVar3,"s");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase).m_sectionStack);
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& _sectionStats ) {
            if( _sectionStats.missingAssertions ) {
                lazyPrint();
                Colour colour( Colour::ResultError );
                if( m_sectionStack.size() > 1 )
                    stream << "\nNo assertions in section";
                else
                    stream << "\nNo assertions in test case";
                stream << " '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
            }
            if( m_headerPrinted ) {
                if( m_config->showDurations() == ShowDurations::Always )
                    stream << "Completed in " << _sectionStats.durationInSeconds << "s" << std::endl;
                m_headerPrinted = false;
            }
            else {
                if( m_config->showDurations() == ShowDurations::Always )
                    stream << _sectionStats.sectionInfo.name << " completed in " << _sectionStats.durationInSeconds << "s" << std::endl;
            }
            StreamingReporterBase::sectionEnded( _sectionStats );
        }